

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.hpp
# Opt level: O1

void benchmarks::detail::BenchmarkInvoker<long>::
     Invoke<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::function<void(benchmarks::BenchmarkContext&,long)>,benchmarks::BenchmarkContext&>
               (string *name,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesBegin,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesEnd,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *serializedParams,function<void_(benchmarks::BenchmarkContext_&,_long)> *f,
               BenchmarkContext *params)

{
  pointer pcVar1;
  const_iterator cVar2;
  runtime_error *this;
  invalid_argument *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param_name;
  long p;
  key_type local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (paramNamesBegin._M_current == paramNamesEnd._M_current) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,name,": parameters count mismatch!");
    std::runtime_error::runtime_error(this,(string *)&local_90);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = ((paramNamesBegin._M_current)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (paramNamesBegin._M_current)->_M_string_length);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&serializedParams->_M_t,&local_90);
  if ((_Rb_tree_header *)cVar2._M_node != &(serializedParams->_M_t)._M_impl.super__Rb_tree_header) {
    local_70 = (long *)BenchmarkParamDeserializer<long>::Deserialize
                                 ((SerializedParam *)(cVar2._M_node + 2));
    BenchmarkInvoker<>::
    Invoke<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<void(benchmarks::BenchmarkContext&,long)>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,benchmarks::BenchmarkContext&,long&>
              (name,paramNamesBegin._M_current + 1,paramNamesEnd,serializedParams,f,params,
               (long *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"No argument named ",&local_90);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static void Invoke(const std::string& name, ParamNamesIter_ paramNamesBegin, ParamNamesIter_ paramNamesEnd, const SerializedParamsMap_& serializedParams, const Functor_& f, ParamTypes_&&... params)
			{
				if (paramNamesBegin == paramNamesEnd)
					throw std::runtime_error(name + ": parameters count mismatch!");

				auto param_name = *paramNamesBegin;
				auto it = serializedParams.find(param_name);
				if (it == serializedParams.end())
					throw std::invalid_argument("No argument named " + param_name + " provided!");

				BenchmarkParamsHead_ p = BenchmarkParamDeserializer<BenchmarkParamsHead_>::Deserialize(it->second);

				BenchmarkInvoker<BenchmarkParamsTail_...>::Invoke(name, std::next(paramNamesBegin), paramNamesEnd, serializedParams, f, std::forward<ParamTypes_>(params)..., p);
			}